

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

Char * Diligent::GetResourceDimString(RESOURCE_DIMENSION TexType)

{
  int iVar1;
  char *pcVar2;
  string msg;
  string local_30;
  
  if (GetResourceDimString(Diligent::RESOURCE_DIMENSION)::TexTypeStrings == '\0') {
    iVar1 = __cxa_guard_acquire(&GetResourceDimString(Diligent::RESOURCE_DIMENSION)::TexTypeStrings)
    ;
    if (iVar1 != 0) {
      GetResourceDimString::TexTypeStrings.TexTypeStrings._M_elems[0] = "Undefined";
      GetResourceDimString::TexTypeStrings.TexTypeStrings._M_elems[1] = "Buffer";
      GetResourceDimString::TexTypeStrings.TexTypeStrings._M_elems[2] = "Texture 1D";
      GetResourceDimString::TexTypeStrings.TexTypeStrings._M_elems[3] = "Texture 1D Array";
      GetResourceDimString::TexTypeStrings.TexTypeStrings._M_elems[4] = "Texture 2D";
      GetResourceDimString::TexTypeStrings.TexTypeStrings._M_elems[5] = "Texture 2D Array";
      GetResourceDimString::TexTypeStrings.TexTypeStrings._M_elems[6] = "Texture 3D";
      GetResourceDimString::TexTypeStrings.TexTypeStrings._M_elems[7] = "Texture Cube";
      GetResourceDimString::TexTypeStrings.TexTypeStrings._M_elems[8] = "Texture Cube Array";
      __cxa_guard_release(&GetResourceDimString(Diligent::RESOURCE_DIMENSION)::TexTypeStrings);
    }
  }
  if (TexType < RESOURCE_DIM_NUM_DIMENSIONS) {
    pcVar2 = GetResourceDimString::TexTypeStrings.TexTypeStrings._M_elems[TexType];
  }
  else {
    pcVar2 = "Unknown texture type";
    FormatString<char[21]>(&local_30,(char (*) [21])"Unknown texture type");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x478);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return pcVar2;
}

Assistant:

const Char* GetResourceDimString(RESOURCE_DIMENSION TexType)
{
    struct ResourceDimToStringMap
    {
        ResourceDimToStringMap()
        {
            TexTypeStrings[RESOURCE_DIM_UNDEFINED]      = "Undefined";
            TexTypeStrings[RESOURCE_DIM_BUFFER]         = "Buffer";
            TexTypeStrings[RESOURCE_DIM_TEX_1D]         = "Texture 1D";
            TexTypeStrings[RESOURCE_DIM_TEX_1D_ARRAY]   = "Texture 1D Array";
            TexTypeStrings[RESOURCE_DIM_TEX_2D]         = "Texture 2D";
            TexTypeStrings[RESOURCE_DIM_TEX_2D_ARRAY]   = "Texture 2D Array";
            TexTypeStrings[RESOURCE_DIM_TEX_3D]         = "Texture 3D";
            TexTypeStrings[RESOURCE_DIM_TEX_CUBE]       = "Texture Cube";
            TexTypeStrings[RESOURCE_DIM_TEX_CUBE_ARRAY] = "Texture Cube Array";
            static_assert(RESOURCE_DIM_NUM_DIMENSIONS == 9, "Not all texture type strings initialized.");
        }

        const Char* operator[](RESOURCE_DIMENSION TexType) const
        {
            if (TexType >= RESOURCE_DIM_UNDEFINED && TexType < RESOURCE_DIM_NUM_DIMENSIONS)
                return TexTypeStrings[TexType];
            else
            {
                UNEXPECTED("Unknown texture type");
                return "Unknown texture type";
            }
        }

    private:
        std::array<const Char*, RESOURCE_DIM_NUM_DIMENSIONS> TexTypeStrings{};
    };

    static const ResourceDimToStringMap TexTypeStrings;
    return TexTypeStrings[TexType];
}